

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O0

FIOBJ fiobj_float_new(double num)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined4 local_28;
  fiobj_float_s *o;
  double num_local;
  
  puVar1 = (undefined8 *)fio_malloc(0x10);
  if (puVar1 == (undefined8 *)0x0) {
    perror("ERROR: fiobj float couldn\'t allocate memory");
    piVar2 = __errno_location();
    exit(*piVar2);
  }
  local_28 = CONCAT31(local_28._1_3_,0x27);
  *puVar1 = CONCAT44(1,local_28);
  puVar1[1] = num;
  return (FIOBJ)puVar1;
}

Assistant:

FIOBJ fiobj_float_new(double num) {
  fiobj_float_s *o = fio_malloc(sizeof(*o));
  if (!o) {
    perror("ERROR: fiobj float couldn't allocate memory");
    exit(errno);
  }
  *o = (fiobj_float_s){
      .head =
          {
              .type = FIOBJ_T_FLOAT,
              .ref = 1,
          },
      .f = num,
  };
  return (FIOBJ)o;
}